

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int __thiscall
fmt::BasicStringRef<char>::compare(BasicStringRef<char> *this,BasicStringRef<char> other)

{
  ulong uVar1;
  int local_44;
  size_t local_40;
  int local_2c;
  int result;
  size_t size;
  BasicStringRef<char> *this_local;
  BasicStringRef<char> other_local;
  
  uVar1 = other.size_;
  local_40 = uVar1;
  if (this->size_ < uVar1) {
    local_40 = this->size_;
  }
  local_2c = std::char_traits<char>::compare(this->data_,other.data_,local_40);
  if (local_2c == 0) {
    if (this->size_ == uVar1) {
      local_44 = 0;
    }
    else {
      local_44 = 1;
      if (this->size_ < uVar1) {
        local_44 = -1;
      }
    }
    local_2c = local_44;
  }
  return local_2c;
}

Assistant:

int compare(BasicStringRef other) const
    {
        std::size_t size = size_ < other.size_ ? size_ : other.size_;
        int result = std::char_traits<Char>::compare(data_, other.data_, size);
        if (result == 0)
            result = size_ == other.size_ ? 0 : (size_ < other.size_ ? -1 : 1);
        return result;
    }